

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall
spvtools::opt::IRContext::CloneNames
          (IRContext *this,uint32_t old_id,uint32_t new_id,uint32_t max_member_index)

{
  pointer puVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> _Var4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> __end2;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> __begin2;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *new_name
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *d;
  IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  IVar5;
  initializer_list<unsigned_int> init_list;
  uint32_t local_84;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_80;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  names_to_add;
  SmallVector<unsigned_int,_2UL> local_58;
  
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IVar5 = GetNames(this,old_id);
  for (_Var4 = IVar5.begin_._M_node;
      puVar1 = names_to_add.
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      d = names_to_add.
          super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start, _Var4._M_node != IVar5.end_._M_node._M_node;
      _Var4._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var4._M_node)) {
    pIVar3 = (Instruction *)_Var4._M_node[1]._M_parent;
    if ((pIVar3->opcode_ != OpMemberName) ||
       (uVar2 = Instruction::GetSingleWordInOperand(pIVar3,1), uVar2 < max_member_index)) {
      pIVar3 = Instruction::Clone(pIVar3,this);
      init_list._M_len = 1;
      init_list._M_array = &local_84;
      local_84 = new_id;
      local_80._M_head_impl = pIVar3;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      Instruction::SetInOperand(pIVar3,0,&local_58);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                  *)&names_to_add,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_80);
      if (local_80._M_head_impl != (Instruction *)0x0) {
        (*((local_80._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
    }
  }
  for (; d != puVar1; d = d + 1) {
    AddDebug2Inst(this,d);
  }
  std::
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ::~vector(&names_to_add);
  return;
}

Assistant:

void IRContext::CloneNames(const uint32_t old_id, const uint32_t new_id,
                           const uint32_t max_member_index) {
  std::vector<std::unique_ptr<Instruction>> names_to_add;
  auto names = GetNames(old_id);
  for (auto n : names) {
    Instruction* old_name_inst = n.second;
    if (old_name_inst->opcode() == spv::Op::OpMemberName) {
      auto midx = old_name_inst->GetSingleWordInOperand(1);
      if (midx >= max_member_index) continue;
    }
    std::unique_ptr<Instruction> new_name_inst(old_name_inst->Clone(this));
    new_name_inst->SetInOperand(0, {new_id});
    names_to_add.push_back(std::move(new_name_inst));
  }
  // We can't add the new names when we are iterating over name range above.
  // We can add all the new names now.
  for (auto& new_name : names_to_add) AddDebug2Inst(std::move(new_name));
}